

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase51::run(TestCase51 *this)

{
  PointerType PVar1;
  Orphanage OVar2;
  MessageSizeCounts MVar3;
  Orphan<capnproto_test::capnp::test::TestEmptyStruct> orphan;
  Builder anyPointer;
  Builder root;
  MallocMessageBuilder builder;
  int local_194;
  OrphanBuilder local_190;
  PointerBuilder local_170;
  undefined1 local_158 [40];
  StructBuilder local_130;
  WordCountN<61,_uint64_t> local_108;
  uint local_100;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_190,&local_f8.super_MessageBuilder);
  local_158._16_8_ = local_190.capTable;
  local_158._0_8_ = local_190.tag.content;
  local_158._8_8_ = local_190.segment;
  PointerBuilder::initStruct(&local_130,(PointerBuilder *)local_158,(StructSize)0x10000);
  local_170.segment = local_130.segment;
  local_170.capTable = local_130.capTable;
  local_170.pointer = local_130.pointers;
  PVar1 = PointerBuilder::getPointerType(&local_170);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37,ERROR,"\"failed: expected \" \"anyPointer.isNull()\"",
               (char (*) [37])"failed: expected anyPointer.isNull()");
  }
  OVar2 = MessageBuilder::getOrphanage(&local_f8.super_MessageBuilder);
  OrphanBuilder::initStruct((OrphanBuilder *)local_158,OVar2.arena,OVar2.capTable,(StructSize)0x0);
  local_190.capTable = (CapTableBuilder *)local_158._16_8_;
  local_190.location = (word *)local_158._24_8_;
  local_190.tag.content = local_158._0_8_;
  local_190.segment = (SegmentBuilder *)local_158._8_8_;
  local_158._16_8_ = local_170.pointer;
  local_158._0_8_ = local_170.segment;
  local_158._8_8_ = local_170.capTable;
  PointerBuilder::adopt((PointerBuilder *)local_158,&local_190);
  PointerBuilder::asReader(&local_170);
  MVar3 = PointerReader::targetSize((PointerReader *)local_158);
  if ((MVar3.wordCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_194 = 0;
    PointerBuilder::asReader(&local_170);
    MVar3 = PointerReader::targetSize((PointerReader *)local_158);
    local_108 = MVar3.wordCount;
    local_100 = MVar3.capCount;
    kj::_::Debug::log<char_const(&)[60],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x3a,ERROR,
               "\"failed: expected \" \"(0) == (anyPointer.targetSize().wordCount)\", 0, anyPointer.targetSize().wordCount"
               ,(char (*) [60])"failed: expected (0) == (anyPointer.targetSize().wordCount)",
               &local_194,&local_108);
  }
  PVar1 = PointerBuilder::getPointerType(&local_170);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x3b,ERROR,"\"failed: expected \" \"!(anyPointer.isNull())\"",
               (char (*) [40])"failed: expected !(anyPointer.isNull())");
  }
  if (local_190.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_190);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, EmptyStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();
  auto anyPointer = root.getAnyPointerField();
  EXPECT_TRUE(anyPointer.isNull());
  auto orphan = builder.getOrphanage().newOrphan<test::TestEmptyStruct>();
  anyPointer.adopt(kj::mv(orphan));
  EXPECT_EQ(0, anyPointer.targetSize().wordCount);
  EXPECT_FALSE(anyPointer.isNull());
}